

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall embree::XMLWriter::store_array_text(XMLWriter *this,char *name,avector<Vec3fa> *vec)

{
  int __oflag;
  long in_RDX;
  char *in_RSI;
  XMLWriter *in_RDI;
  size_t i;
  Vec3fa *in_stack_ffffffffffffff38;
  XMLWriter *in_stack_ffffffffffffff40;
  allocator local_91;
  string local_90 [32];
  ulong local_70;
  allocator local_51;
  string local_50 [32];
  long local_30;
  char *local_28;
  long local_18;
  ulong local_10;
  long local_8;
  
  local_30 = in_RDX;
  local_28 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,in_RSI,&local_51);
  open(in_RDI,(char *)local_50,__oflag);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  for (local_70 = 0; local_18 = local_30, local_70 < *(ulong *)(local_30 + 8);
      local_70 = local_70 + 1) {
    tab(in_stack_ffffffffffffff40);
    local_8 = local_30;
    local_10 = local_70;
    store_array_elt(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,local_28,&local_91);
  close(in_RDI,(int)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  return;
}

Assistant:

void XMLWriter::store_array_text(const char* name, const avector<Vec3fa>& vec)
  {
    open(name);
    for (size_t i=0; i<vec.size(); i++) {
      tab(); store_array_elt(vec[i]);
    }
    close(name);
  }